

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::normalize_space(char_t *buffer)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  char_t *write;
  
  bVar4 = *buffer;
  pbVar2 = (byte *)buffer;
  pbVar3 = (byte *)buffer;
  do {
    if (bVar4 == 0) {
      if ((pbVar2 != (byte *)buffer) &&
         (((anonymous_namespace)::chartype_table[pbVar2[-1]] & 8) != 0)) {
        pbVar2 = pbVar2 + -1;
      }
      *pbVar2 = 0;
      return (char_t *)pbVar2;
    }
    if (((anonymous_namespace)::chartype_table[bVar4] & 8) == 0) {
      pbVar3 = pbVar3 + 1;
LAB_001926e2:
      *pbVar2 = bVar4;
      pbVar2 = pbVar2 + 1;
    }
    else {
      do {
        pbVar1 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0);
      bVar4 = 0x20;
      if (pbVar2 != (byte *)buffer) goto LAB_001926e2;
    }
    bVar4 = *pbVar3;
  } while( true );
}

Assistant:

PUGI__FN char_t* normalize_space(char_t* buffer)
	{
		char_t* write = buffer;

		for (char_t* it = buffer; *it; )
		{
			char_t ch = *it++;

			if (PUGI__IS_CHARTYPE(ch, ct_space))
			{
				// replace whitespace sequence with single space
				while (PUGI__IS_CHARTYPE(*it, ct_space)) it++;

				// avoid leading spaces
				if (write != buffer) *write++ = ' ';
			}
			else *write++ = ch;
		}

		// remove trailing space
		if (write != buffer && PUGI__IS_CHARTYPE(write[-1], ct_space)) write--;

		// zero-terminate
		*write = 0;

		return write;
	}